

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_longnames.cpp
# Opt level: O2

void __thiscall
icu_63::number::impl::LongNameHandler::processQuantity
          (LongNameHandler *this,DecimalQuantity *quantity,MicroProps *micros,UErrorCode *status)

{
  Form FVar1;
  DecimalQuantity copy;
  DecimalQuantity DStack_78;
  
  (*this->parent->_vptr_MicroPropsGenerator[2])();
  DecimalQuantity::DecimalQuantity(&DStack_78,quantity);
  RoundingImpl::apply(&micros->rounder,&DStack_78,status);
  FVar1 = utils::getStandardPlural(this->rules,&DStack_78.super_IFixedDecimal);
  micros->modOuter = (Modifier *)(&this->field_0x10 + (ulong)FVar1 * 0x70);
  DecimalQuantity::~DecimalQuantity(&DStack_78);
  return;
}

Assistant:

void LongNameHandler::processQuantity(DecimalQuantity &quantity, MicroProps &micros,
                                      UErrorCode &status) const {
    parent->processQuantity(quantity, micros, status);
    // TODO: Avoid the copy here?
    DecimalQuantity copy(quantity);
    micros.rounder.apply(copy, status);
    micros.modOuter = &fModifiers[utils::getStandardPlural(rules, copy)];
}